

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O3

void mod2sparse_merge_vec(mod2sparse *m1,char *vec,int n,mod2sparse *m2)

{
  int col;
  ulong uVar1;
  
  if (((m2->n_cols <= m1->n_cols) || (m2->n_rows < n)) || (m2->n_rows < m1->n_rows)) {
    printf("mod2sparse_merge_vec: the receiving matrix doesn\'t have the good dimensions");
  }
  mod2sparse_copy(m1,m2);
  if (0 < n) {
    col = m1->n_cols;
    uVar1 = 0;
    do {
      if (vec[uVar1] != '\0') {
        mod2sparse_insert(m2,(int)uVar1,col);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return;
}

Assistant:

void mod2sparse_merge_vec(mod2sparse* m1, char *vec, int n, mod2sparse* m2) {

    if (mod2sparse_cols(m2) < mod2sparse_cols(m1) + 1 || mod2sparse_rows(m2) < mod2sparse_rows(m1)  || mod2sparse_rows(m2) < n) {
        printf("mod2sparse_merge_vec: the receiving matrix doesn't have the good dimensions");
    }

    mod2sparse_copy(m1,m2);

    int ncols = mod2sparse_cols(m1);
 
    for (int i = 0; i < n; i++){
        if (vec[i] != 0){ 
            mod2sparse_insert(m2,i,ncols);
        }
    }

}